

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O3

int __thiscall
sliding_puzzle::SlidingPuzzle::calculateHammingDistance
          (SlidingPuzzle *this,SlidingPuzzleStatePtr *state)

{
  int iVar1;
  element_type *peVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  peVar2 = (state->
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  lVar3 = (long)(peVar2->state_).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(peVar2->state_).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - lVar3;
  if (lVar7 == 0) {
    iVar8 = 0;
  }
  else {
    lVar7 = (lVar7 >> 3) * -0x5555555555555555;
    uVar10 = 0;
    iVar8 = 0;
    do {
      lVar4 = *(long *)(lVar3 + uVar10 * 0x18);
      lVar11 = *(long *)(lVar3 + 8 + uVar10 * 0x18) - lVar4;
      if (lVar11 != 0) {
        lVar11 = lVar11 >> 2;
        uVar9 = 0;
        do {
          iVar1 = *(int *)(lVar4 + uVar9 * 4);
          iVar6 = iVar8;
          if ((iVar1 != 0) &&
             (lVar5 = (long)(iVar1 + -1), iVar6 = iVar8 + 1,
             (lVar5 % (long)puzzle_size & 0xffffffffU) == uVar9 &&
             (lVar5 / (long)puzzle_size & 0xffffffffU) == uVar10)) {
            iVar6 = iVar8;
          }
          iVar8 = iVar6;
          uVar9 = uVar9 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != uVar9);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != lVar7 + (ulong)(lVar7 == 0));
  }
  return iVar8;
}

Assistant:

int SlidingPuzzle::calculateHammingDistance(const SlidingPuzzleStatePtr& state)
{
  int hamming_distance = 0;

  int target_location[2];
  for (int i=0; i<state->state_.size(); ++i)
  {
    for (int j=0; j<state->state_[i].size(); ++j)
    {
      if (state->state_[i][j] != 0)
      {
        target_location[0] = (state->state_[i][j]-1)/puzzle_size;
        target_location[1] = (state->state_[i][j]-1)%puzzle_size;

        if (i != target_location[0] ||
            j != target_location[1])
        {
          hamming_distance += 1;
        }
      }
    }
  }

  return hamming_distance;
}